

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void duckdb_parquet::swap(ColumnChunk *a,ColumnChunk *b)

{
  ColumnMetaData *in_RSI;
  long in_RDI;
  ColumnMetaData *in_stack_ffffffffffffffe8;
  
  std::swap<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe8);
  std::swap<long>((long *)(in_RDI + 0x28),(long *)&in_RSI->path_in_schema);
  swap(in_RSI,in_stack_ffffffffffffffe8);
  std::swap<long>((long *)(in_RDI + 0x1d8),
                  (long *)&in_RSI[1].path_in_schema.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
  std::swap<int>((int *)(in_RDI + 0x1e0),
                 (int *)&in_RSI[1].path_in_schema.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::swap<long>((long *)(in_RDI + 0x1e8),(long *)&in_RSI[1].codec);
  std::swap<int>((int *)(in_RDI + 0x1f0),(int *)&in_RSI[1].num_values);
  swap((ColumnCryptoMetaData *)in_RSI,(ColumnCryptoMetaData *)in_stack_ffffffffffffffe8);
  std::swap<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe8);
  std::swap<duckdb_parquet::_ColumnChunk__isset>
            ((_ColumnChunk__isset *)(in_RDI + 0x278),
             (_ColumnChunk__isset *)(in_RSI[1].statistics.min.field_2._M_local_buf + 8));
  return;
}

Assistant:

void swap(ColumnChunk &a, ColumnChunk &b) {
  using ::std::swap;
  swap(a.file_path, b.file_path);
  swap(a.file_offset, b.file_offset);
  swap(a.meta_data, b.meta_data);
  swap(a.offset_index_offset, b.offset_index_offset);
  swap(a.offset_index_length, b.offset_index_length);
  swap(a.column_index_offset, b.column_index_offset);
  swap(a.column_index_length, b.column_index_length);
  swap(a.crypto_metadata, b.crypto_metadata);
  swap(a.encrypted_column_metadata, b.encrypted_column_metadata);
  swap(a.__isset, b.__isset);
}